

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDateTime toEarliest(QDate day,QTimeZone *zone)

{
  QDate date;
  int iVar1;
  bool bVar2;
  int iVar3;
  time_t tVar4;
  time_t ****in_RSI;
  time_t ****__timer;
  time_t ****pppptVar5;
  Data in_RDI;
  long in_FS_OFFSET;
  int min;
  int mid_1;
  int mid;
  int low;
  int high;
  QDateTime probe_1;
  QDateTime p;
  QDateTime probe;
  QDateTime when;
  anon_class_16_2_20c63607 moment;
  int in_stack_fffffffffffffe88;
  TransitionResolution in_stack_fffffffffffffe8c;
  QDateTime *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  QTime in_stack_fffffffffffffeac;
  undefined8 in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebe;
  bool bVar6;
  undefined1 in_stack_fffffffffffffebf;
  bool local_12a;
  int local_d0;
  int local_cc;
  time_t **local_60;
  QTime local_58 [2];
  time_t **local_50 [2];
  time_t **local_40 [2];
  Data local_30;
  time_t **local_28;
  undefined1 *puStack_20;
  time_t ***local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = (time_t ***)in_RSI;
  QTimeZone::QTimeZone
            ((QTimeZone *)in_stack_fffffffffffffe90,
             (QTimeZone *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  local_30.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QTime::QTime((QTime *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
               in_stack_fffffffffffffe88,0,0x566c54);
  __timer = (time_t ****)&local_28;
  toEarliest::anon_class_16_2_20c63607::operator()
            ((anon_class_16_2_20c63607 *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),in_stack_fffffffffffffeac
            );
  bVar2 = QDateTime::isValid(in_stack_fffffffffffffe90);
  if (!bVar2) {
    QTime::QTime((QTime *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                 in_stack_fffffffffffffe88,0,0x566cb6);
    toEarliest::anon_class_16_2_20c63607::operator()
              ((anon_class_16_2_20c63607 *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               in_stack_fffffffffffffeac);
    __timer = (time_t ****)local_40;
    QDateTime::operator=
              (in_stack_fffffffffffffe90,
               (QDateTime *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    QDateTime::~QDateTime((QDateTime *)0x566cff);
    bVar2 = QDateTime::isValid(in_stack_fffffffffffffe90);
    if (!bVar2) {
      QTime::QTime((QTime *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                   in_stack_fffffffffffffe88,0,0x566d42);
      toEarliest::anon_class_16_2_20c63607::operator()
                ((anon_class_16_2_20c63607 *)
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 in_stack_fffffffffffffeac);
      __timer = (time_t ****)local_50;
      QDateTime::operator=
                (in_stack_fffffffffffffe90,
                 (QDateTime *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QDateTime::~QDateTime((QDateTime *)0x566d8b);
      bVar2 = QDateTime::isValid(in_stack_fffffffffffffe90);
      if (!bVar2) {
        QDateTime::QDateTime((QDateTime *)0x566db2);
        goto LAB_00567336;
      }
    }
  }
  tVar4 = QDateTime::time((QDateTime *)&local_30.data,(time_t *)__timer);
  local_58[0].mds = (int)tVar4;
  local_cc = QTime::msecsSinceStartOfDay(local_58);
  local_cc = local_cc / 60000;
  local_d0 = 0;
  while (pppptVar5 = (time_t ****)local_10, local_d0 + 1 < local_cc) {
    iVar3 = (local_cc + local_d0) / 2;
    local_60 = (time_t **)&DAT_aaaaaaaaaaaaaaaa;
    QTime::QTime((QTime *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                 in_stack_fffffffffffffe88,0,0x566ee5);
    date.jd._6_1_ = in_stack_fffffffffffffebe;
    date.jd._0_6_ = in_stack_fffffffffffffeb8;
    date.jd._7_1_ = in_stack_fffffffffffffebf;
    QDateTime::QDateTime
              ((QDateTime *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),date,
               (QTime)(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
               (QTimeZone *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    bVar2 = QDateTime::isValid(in_stack_fffffffffffffe90);
    local_12a = false;
    __timer = pppptVar5;
    if (bVar2) {
      QDateTime::date((QDateTime *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      __timer = &local_10;
      local_12a = operator==((QDate *)in_stack_fffffffffffffe90,
                             (QDate *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
      ;
    }
    iVar1 = iVar3;
    if (local_12a != false) {
      __timer = (time_t ****)&local_60;
      QDateTime::operator=
                (in_stack_fffffffffffffe90,
                 (QDateTime *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      iVar1 = local_d0;
      local_cc = iVar3;
    }
    local_d0 = iVar1;
    QDateTime::~QDateTime((QDateTime *)0x566fe5);
  }
  QDateTime::time((QDateTime *)&local_30.data,(time_t *)__timer);
  QTime::addSecs((QTime *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
  toEarliest::anon_class_16_2_20c63607::operator()
            ((anon_class_16_2_20c63607 *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),in_stack_fffffffffffffeac
            );
  bVar2 = QDateTime::isValid(in_stack_fffffffffffffe90);
  bVar6 = false;
  if (bVar2) {
    QDateTime::date((QDateTime *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    bVar6 = operator==((QDate *)in_stack_fffffffffffffe90,
                       (QDate *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  }
  if (bVar6 != false) {
    local_cc = local_cc * 0x3c;
    local_d0 = local_d0 * 0x3c;
    while (local_d0 + 1 < local_cc) {
      iVar3 = (local_cc + local_d0) / 2;
      QTime::QTime((QTime *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                   in_stack_fffffffffffffe88,0,0x5671b9);
      toEarliest::anon_class_16_2_20c63607::operator()
                ((anon_class_16_2_20c63607 *)
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 in_stack_fffffffffffffeac);
      bVar2 = QDateTime::isValid(in_stack_fffffffffffffe90);
      in_stack_fffffffffffffeac.mds =
           CONCAT13(bVar2,(int3)in_stack_fffffffffffffeac.mds) & 0xff00ffff;
      if (bVar2) {
        QDateTime::date((QDateTime *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        bVar2 = operator==((QDate *)in_stack_fffffffffffffe90,
                           (QDate *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        in_stack_fffffffffffffeac.mds =
             CONCAT13((char)((uint)in_stack_fffffffffffffeac.mds >> 0x18),
                      CONCAT12(bVar2,(short)in_stack_fffffffffffffeac.mds));
      }
      iVar1 = iVar3;
      if ((char)((uint)in_stack_fffffffffffffeac.mds >> 0x10) != '\0') {
        QDateTime::operator=
                  (in_stack_fffffffffffffe90,
                   (QDateTime *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        iVar1 = local_d0;
        local_cc = iVar3;
      }
      local_d0 = iVar1;
      QDateTime::~QDateTime((QDateTime *)0x5672c5);
    }
  }
  QDateTime::~QDateTime((QDateTime *)0x5672d9);
  bVar2 = QDateTime::isValid(in_stack_fffffffffffffe90);
  if (bVar2) {
    QDateTime::QDateTime
              (in_stack_fffffffffffffe90,
               (QDateTime *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  }
  else {
    QDateTime::QDateTime((QDateTime *)0x56731a);
  }
LAB_00567336:
  QDateTime::~QDateTime((QDateTime *)0x567343);
  toEarliest(QDate,QTimeZone_const&)::$_0::~__0((anon_class_16_2_20c63607 *)0x567350);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDateTime)in_RDI;
}

Assistant:

static QDateTime toEarliest(QDate day, const QTimeZone &zone)
{
    Q_ASSERT(!zone.isUtcOrFixedOffset());
    // And the day starts in a gap. First find a moment not in that gap.
    const auto moment = [=](QTime time) {
        return QDateTime(day, time, zone, QDateTime::TransitionResolution::Reject);
    };
    // Longest routine time-zone transition is 2 hours:
    QDateTime when = moment(QTime(2, 0));
    if (!when.isValid()) {
        // Noon should be safe ...
        when = moment(QTime(12, 0));
        if (!when.isValid()) {
            // ... unless it's a 24-hour jump (moving the date-line)
            when = moment(QTime(23, 59, 59, 999));
            if (!when.isValid())
                return QDateTime();
        }
    }
    int high = when.time().msecsSinceStartOfDay() / 60000;
    int low = 0;
    // Binary chop to the right minute
    while (high > low + 1) {
        const int mid = (high + low) / 2;
        const QDateTime probe = QDateTime(day, QTime(mid / 60, mid % 60), zone,
                                          QDateTime::TransitionResolution::PreferBefore);
        if (probe.isValid() && probe.date() == day) {
            high = mid;
            when = probe;
        } else {
            low = mid;
        }
    }
    // Transitions out of local solar mean time, and the few international
    // date-line crossings before that (Alaska, Philippines), may have happened
    // between minute boundaries. Don't try to fix milliseconds.
    if (QDateTime p = moment(when.time().addSecs(-1)); Q_UNLIKELY(p.isValid() && p.date() == day)) {
        high *= 60;
        low *= 60;
        while (high > low + 1) {
            const int mid = (high + low) / 2;
            const int min = mid / 60;
            const QDateTime probe = moment(QTime(min / 60, min % 60, mid % 60));
            if (probe.isValid() && probe.date() == day) {
                high = mid;
                when = probe;
            } else {
                low = mid;
            }
        }
    }
    return when.isValid() ? when : QDateTime();
}